

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateExternalFunction
          (JavascriptLibrary *this,ExternalMethod entryPoint,PropertyId nameId,Var signature,
          UINT64 flags,bool isLengthAvailable)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptExternalFunction *pJVar4;
  
  if (nameId != 0) {
    bVar2 = ScriptContext::IsTrackedPropertyId
                      ((this->super_JavascriptLibraryBase).scriptContext.ptr,nameId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x169c,
                                  "(nameId == 0 || scriptContext->IsTrackedPropertyId(nameId))",
                                  "nameId == 0 || scriptContext->IsTrackedPropertyId(nameId)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  pJVar4 = CreateExternalFunction
                     (this,entryPoint,(Var)((ulong)(uint)nameId | 0x1000000000000),signature,flags,
                      isLengthAvailable);
  return pJVar4;
}

Assistant:

JavascriptExternalFunction*
    JavascriptLibrary::CreateExternalFunction(ExternalMethod entryPoint, PropertyId nameId, Var signature, UINT64 flags, bool isLengthAvailable)
    {
        Assert(nameId == 0 || scriptContext->IsTrackedPropertyId(nameId));
        return CreateExternalFunction(entryPoint, TaggedInt::ToVarUnchecked(nameId), signature, flags, isLengthAvailable);
    }